

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.cpp
# Opt level: O2

void __thiscall gdsPATH::to_str(gdsPATH *this)

{
  pointer piVar1;
  uint uVar2;
  ostream *poVar3;
  ulong uVar4;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"GDS PATH class:");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"  layer: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"  width: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"  xCor:\tyCor:");
  std::endl<char,std::char_traits<char>>(poVar3);
  uVar2 = 0;
  while( true ) {
    uVar4 = (ulong)uVar2;
    piVar1 = (this->xCor).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->xCor).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar1 >> 2) <= uVar4) break;
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,piVar1[uVar4]);
    poVar3 = std::operator<<(poVar3,"\t");
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,(this->xCor).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[uVar4]);
    std::endl<char,std::char_traits<char>>(poVar3);
    uVar2 = uVar2 + 1;
  }
  return;
}

Assistant:

void gdsPATH::to_str()
{
  cout << "GDS PATH class:" << endl;

  cout << "  layer: " << this->layer << endl;
  cout << "  width: " << this->width << endl;

  cout << "  xCor:\tyCor:" << endl;
  for (unsigned int i = 0; i < this->xCor.size(); i++) {
    cout << this->xCor[i] << "\t" << this->xCor[i] << endl;
  }
}